

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_detection.cpp
# Opt level: O2

void __thiscall duckdb::CSVSniffer::DetectTypes(CSVSniffer *this)

{
  element_type *peVar1;
  CSVReaderOptions *pCVar2;
  _Hash_node_base *p_Var3;
  long *plVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  pointer this_00;
  CSVStateMachine *state_machine;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_01;
  pointer pSVar9;
  type candidate;
  undefined4 extraout_var;
  DataChunk *data_chunk;
  CSVErrorHandler *pCVar10;
  CSVStateMachine *pCVar11;
  mapped_type *this_02;
  reference this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  _Rb_tree_node_base *p_Var12;
  reference vector;
  pointer *__ptr;
  element_type *this_05;
  idx_t start_idx_detection;
  ulong uVar13;
  ulong uVar14;
  undefined1 local_218 [56];
  ValidityMask null_mask;
  vector<duckdb::LogicalType,_true> return_types;
  HeaderValue value;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  info_sql_types_candidates;
  
  local_218._24_8_ = this->max_columns_found + 1;
  return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_05 = (element_type *)
            (this->candidates).
            super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (element_type *)
           (this->candidates).
           super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_218._40_8_ = &this->best_header_row;
  local_218._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
  local_218._8_8_ = this;
  do {
    uVar6 = local_218._8_8_;
    if (this_05 == peVar1) {
      if ((((CSVReaderOptions *)(local_218._8_8_ + 0x1b0))->dialect_options).state_machine_options.
          delimiter.value._M_dataplus._M_p == (pointer)0x0) {
        DialectCandidates::DialectCandidates
                  ((DialectCandidates *)&info_sql_types_candidates,
                   (CSVStateMachineOptions *)
                   (((BaseFileReader *)local_218._8_8_)->cast_map)._M_h._M_buckets);
        pCVar2 = (CSVReaderOptions *)(((BaseFileReader *)uVar6)->cast_map)._M_h._M_buckets;
        DialectCandidates::Print_abi_cxx11_
                  ((string *)&null_mask,(DialectCandidates *)&info_sql_types_candidates);
        CSVError::SniffingError
                  ((CSVError *)&value,pCVar2,(string *)&null_mask,
                   (idx_t)(((BaseFileReader *)uVar6)->expression_map)._M_h._M_before_begin._M_nxt,
                   (SetColumns *)&(((BaseFileReader *)uVar6)->cast_map)._M_h._M_rehash_policy);
        ::std::__cxx11::string::~string((string *)&null_mask);
        pCVar10 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                            ((shared_ptr<duckdb::CSVErrorHandler,_true> *)
                             &(((BaseFileReader *)uVar6)->cast_map)._M_h._M_single_bucket);
        CSVErrorHandler::Error(pCVar10,(CSVError *)&value,true);
        CSVError::~CSVError((CSVError *)&value);
        DialectCandidates::~DialectCandidates((DialectCandidates *)&info_sql_types_candidates);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                (&return_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      return;
    }
    local_218._48_8_ = this_05;
    this_00 = unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
              ::operator->((unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                            *)this_05);
    state_machine = BaseScanner::GetStateMachine(&this_00->super_BaseScanner);
    info_sql_types_candidates._M_h._M_buckets = &info_sql_types_candidates._M_h._M_single_bucket;
    info_sql_types_candidates._M_h._M_bucket_count = 1;
    info_sql_types_candidates._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    info_sql_types_candidates._M_h._M_element_count = 0;
    info_sql_types_candidates._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    info_sql_types_candidates._M_h._M_rehash_policy._M_next_resize = 0;
    info_sql_types_candidates._M_h._M_single_bucket = (__node_base_ptr)0x0;
    for (value._0_8_ = (_Hash_node_base *)0x0;
        (ulong)value._0_8_ < (((BaseFileReader *)uVar6)->expression_map)._M_h._M_before_begin._M_nxt
        ; value._0_8_ = value._0_8_ + 1) {
      pCVar2 = state_machine->options;
      this_01 = &::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&info_sql_types_candidates,(key_type *)&value)->
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (this_01,&(pCVar2->auto_type_candidates).
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::clear
              (&return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
              );
    p_Var3 = (((BaseFileReader *)uVar6)->expression_map)._M_h._M_before_begin._M_nxt;
    LogicalType::LogicalType((LogicalType *)&value,VARCHAR);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_fill_assign
              (&return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
               ,(size_type)p_Var3,(value_type *)&value);
    LogicalType::~LogicalType((LogicalType *)&value);
    unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>::
    operator->((unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>
                *)local_218._48_8_);
    ColumnCountScanner::UpgradeToStringValueScanner((ColumnCountScanner *)local_218);
    pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)local_218);
    candidate = shared_ptr<duckdb::CSVStateMachine,_true>::operator*
                          (&(pSVar9->super_BaseScanner).state_machine);
    SetUserDefinedDateTimeFormat((CSVSniffer *)uVar6,candidate);
    pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)local_218);
    iVar8 = (*(pSVar9->super_BaseScanner)._vptr_BaseScanner[2])(pSVar9);
    data_chunk = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar8));
    pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
             ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                           *)local_218);
    pCVar10 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                        (&(pSVar9->super_BaseScanner).error_handler);
    bVar7 = CSVErrorHandler::AnyErrors(pCVar10);
    if (bVar7) {
      pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
               ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                             *)local_218);
      pCVar10 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                          (&(pSVar9->super_BaseScanner).error_handler);
      bVar7 = CSVErrorHandler::HasError(pCVar10,MAXIMUM_LINE_SIZE);
      if (bVar7) goto LAB_019a79e0;
      pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
               ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                             *)local_218);
      pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                          (&(pSVar9->super_BaseScanner).state_machine);
      if ((pCVar11->options->ignore_errors).value != false) goto LAB_019a79e0;
    }
    else {
LAB_019a79e0:
      uVar13 = data_chunk->count;
      if ((uVar13 < 2) ||
         ((pCVar2 = (CSVReaderOptions *)(((BaseFileReader *)uVar6)->cast_map)._M_h._M_buckets,
          (pCVar2->dialect_options).header.set_by_user == true &&
          ((pCVar2->dialect_options).header.value != true)))) {
        start_idx_detection = 0;
      }
      else {
        start_idx_detection = 1;
      }
      SniffTypes((CSVSniffer *)uVar6,data_chunk,state_machine,&info_sql_types_candidates,
                 start_idx_detection);
      uVar14 = 0;
      for (null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0
          ; null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask <
            info_sql_types_candidates._M_h._M_element_count;
          null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               ((long)null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask + 1)) {
        this_02 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&info_sql_types_candidates,(key_type *)&null_mask);
        this_03 = vector<duckdb::LogicalType,_true>::back(this_02);
        LogicalType::LogicalType((LogicalType *)&value,VARCHAR);
        bVar7 = LogicalType::operator==(this_03,(LogicalType *)&value);
        LogicalType::~LogicalType((LogicalType *)&value);
        uVar14 = uVar14 + bVar7;
      }
      pSVar9 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
               ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                             *)local_218);
      pCVar10 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                          (&(pSVar9->super_BaseScanner).error_handler);
      local_218._32_8_ = CSVErrorHandler::GetSize(pCVar10);
      if (((((CSVReaderOptions *)(local_218._8_8_ + 0x1b0))->dialect_options).state_machine_options.
           delimiter.value._M_dataplus._M_p == (pointer)0x0) ||
         (((uVar14 < (ulong)local_218._24_8_ &&
           (p_Var3 = (((BaseFileReader *)local_218._8_8_)->expression_map)._M_h._M_before_begin.
                     _M_nxt,
           (((double)CONCAT44(0x45300000,(int)((ulong)p_Var3 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)p_Var3) - 4503599627370496.0)) * 0.7 <
           ((double)CONCAT44(0x45300000,
                             (int)(info_sql_types_candidates._M_h._M_element_count >> 0x20)) -
           1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)info_sql_types_candidates._M_h._M_element_count) -
           4503599627370496.0))) &&
          (((((CSVReaderOptions *)(((BaseFileReader *)local_218._8_8_)->cast_map)._M_h._M_buckets)->
            ignore_errors).value != true || ((ulong)local_218._32_8_ < (ulong)local_218._16_8_))))))
      {
        ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::clear
                  ((vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *)
                   local_218._40_8_);
        uVar6 = local_218._0_8_;
        local_218._0_8_ = (StringValueScanner *)0x0;
        plVar4 = (long *)(((CSVReaderOptions *)(local_218._8_8_ + 0x1b0))->dialect_options).
                         state_machine_options.delimiter.value._M_dataplus._M_p;
        (((CSVReaderOptions *)(local_218._8_8_ + 0x1b0))->dialect_options).state_machine_options.
        delimiter.value._M_dataplus._M_p = (pointer)uVar6;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
        ::std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::operator=(&(this->best_sql_types_candidates_per_column_idx)._M_h,
                    &info_sql_types_candidates._M_h);
        for (p_Var12 = *(_Rb_tree_node_base **)
                        &(((CSVReaderOptions *)(local_218._8_8_ + 0x1b0))->dialect_options).header;
            (_Rb_tree_header *)p_Var12 !=
            &(this->format_candidates)._M_t._M_impl.super__Rb_tree_header;
            p_Var12 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var12)) {
          this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)::std::
                       map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
                       ::operator[](&this->best_format_candidates,(key_type *)(p_Var12 + 1));
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(this_04,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&p_Var12[1]._M_left);
        }
        if (uVar13 != 0) {
          (((CSVReaderOptions *)(local_218._8_8_ + 0x1b0))->rejects_scan_name).set_by_user =
               uVar13 == 1;
          for (uVar13 = 0;
              uVar13 < (ulong)(((long)(data_chunk->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(data_chunk->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x68);
              uVar13 = uVar13 + 1) {
            vector = vector<duckdb::Vector,_true>::get<true>(&data_chunk->data,uVar13);
            paVar5 = (anon_union_16_2_67f50693_for_value *)vector->data;
            FlatVector::VerifyFlatVector(vector);
            TemplatedValidityMask<unsigned_long>::TemplatedValidityMask
                      (&null_mask.super_TemplatedValidityMask<unsigned_long>,
                       &(vector->validity).super_TemplatedValidityMask<unsigned_long>);
            if ((null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0) ||
               ((*null_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0)) {
              HeaderValue::HeaderValue(&value,(string_t)paVar5->pointer);
              ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::push_back
                        ((vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *)
                         local_218._40_8_,&value);
            }
            else {
              value.is_null = true;
              value.value._M_dataplus._M_p = (pointer)&value.value.field_2;
              value.value._M_string_length = 0;
              value.value.field_2._M_local_buf[0] = '\0';
              ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::
              emplace_back<duckdb::HeaderValue>
                        ((vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_> *)
                         local_218._40_8_,&value);
            }
            ::std::__cxx11::string::~string((string *)&value.value);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&null_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
        local_218._16_8_ = local_218._32_8_;
        local_218._24_8_ = uVar14;
      }
    }
    if ((StringValueScanner *)local_218._0_8_ != (StringValueScanner *)0x0) {
      (*((BaseScanner *)local_218._0_8_)->_vptr_BaseScanner[1])();
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&info_sql_types_candidates._M_h);
    this_05 = (element_type *)(local_218._48_8_ + 8);
  } while( true );
}

Assistant:

void CSVSniffer::DetectTypes() {
	idx_t min_varchar_cols = max_columns_found + 1;
	idx_t min_errors = NumericLimits<idx_t>::Maximum();
	vector<LogicalType> return_types;
	// check which info candidate leads to minimum amount of non-varchar columns...
	for (auto &candidate_cc : candidates) {
		auto &sniffing_state_machine = candidate_cc->GetStateMachine();
		unordered_map<idx_t, vector<LogicalType>> info_sql_types_candidates;
		for (idx_t i = 0; i < max_columns_found; i++) {
			info_sql_types_candidates[i] = sniffing_state_machine.options.auto_type_candidates;
		}
		D_ASSERT(max_columns_found > 0);

		// Set all return_types to VARCHAR, so we can do datatype detection based on VARCHAR values
		return_types.clear();
		return_types.assign(max_columns_found, LogicalType::VARCHAR);

		// Reset candidate for parsing
		auto candidate = candidate_cc->UpgradeToStringValueScanner();
		SetUserDefinedDateTimeFormat(*candidate->state_machine);
		// Parse chunk and read csv with info candidate
		auto &data_chunk = candidate->ParseChunk().ToChunk();
		if (candidate->error_handler->AnyErrors() && !candidate->error_handler->HasError(MAXIMUM_LINE_SIZE) &&
		    !candidate->state_machine->options.ignore_errors.GetValue()) {
			continue;
		}
		idx_t start_idx_detection = 0;
		idx_t chunk_size = data_chunk.size();
		if (chunk_size > 1 &&
		    (!options.dialect_options.header.IsSetByUser() ||
		     (options.dialect_options.header.IsSetByUser() && options.dialect_options.header.GetValue()))) {
			// This means we have more than one row, hence we can use the first row to detect if we have a header
			start_idx_detection = 1;
		}
		// First line where we start our type detection
		SniffTypes(data_chunk, sniffing_state_machine, info_sql_types_candidates, start_idx_detection);

		// Count the number of varchar columns
		idx_t varchar_cols = 0;
		for (idx_t col = 0; col < info_sql_types_candidates.size(); col++) {
			auto &col_type_candidates = info_sql_types_candidates[col];
			// check number of varchar columns
			const auto &col_type = col_type_candidates.back();
			if (col_type == LogicalType::VARCHAR) {
				varchar_cols++;
			}
		}

		// it's good if the dialect creates more non-varchar columns, but only if we sacrifice < 30% of
		// best_num_cols.
		const idx_t number_of_errors = candidate->error_handler->GetSize();
		if (!best_candidate || (varchar_cols<min_varchar_cols &&static_cast<double>(info_sql_types_candidates.size())>(
		                            static_cast<double>(max_columns_found) * 0.7) &&
		                        (!options.ignore_errors.GetValue() || number_of_errors < min_errors))) {
			min_errors = number_of_errors;
			best_header_row.clear();
			// we have a new best_options candidate
			best_candidate = std::move(candidate);
			min_varchar_cols = varchar_cols;
			best_sql_types_candidates_per_column_idx = info_sql_types_candidates;
			for (auto &format_candidate : format_candidates) {
				best_format_candidates[format_candidate.first] = format_candidate.second.format;
			}
			if (chunk_size > 0) {
				single_row_file = chunk_size == 1;
				for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
					auto &cur_vector = data_chunk.data[col_idx];
					auto vector_data = FlatVector::GetData<string_t>(cur_vector);
					auto null_mask = FlatVector::Validity(cur_vector);
					if (null_mask.RowIsValid(0)) {
						auto value = HeaderValue(vector_data[0]);
						best_header_row.push_back(value);
					} else {
						best_header_row.push_back({});
					}
				}
			}
		}
	}
	if (!best_candidate) {
		DialectCandidates dialect_candidates(options.dialect_options.state_machine_options);
		auto error = CSVError::SniffingError(options, dialect_candidates.Print(), max_columns_found, set_columns);
		error_handler->Error(error, true);
	}
	// Assert that it's all good at this point.
	D_ASSERT(best_candidate && !best_format_candidates.empty());
}